

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii85.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  void *__buf;
  FILE *__n;
  exception *e;
  size_t len;
  undefined1 local_27b8 [7];
  bool done;
  uchar buf [10000];
  undefined1 local_98 [8];
  Pl_ASCII85Decoder decode;
  Pl_StdioFile out;
  
  Pl_StdioFile::Pl_StdioFile((Pl_StdioFile *)&decode.error,"stdout",_stdout);
  Pl_ASCII85Decoder::Pl_ASCII85Decoder
            ((Pl_ASCII85Decoder *)local_98,"decode",(Pipeline *)&decode.error);
  bVar1 = false;
  while (!bVar1) {
    __n = _stdin;
    __buf = (void *)fread(local_27b8,1,10000,_stdin);
    if (__buf == (void *)0x0) {
      bVar1 = true;
    }
    else {
      Pl_ASCII85Decoder::write((Pl_ASCII85Decoder *)local_98,(int)local_27b8,__buf,(size_t)__n);
    }
  }
  Pl_ASCII85Decoder::finish((Pl_ASCII85Decoder *)local_98);
  Pl_ASCII85Decoder::~Pl_ASCII85Decoder((Pl_ASCII85Decoder *)local_98);
  Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)&decode.error);
  return 0;
}

Assistant:

int
main()
{
    Pl_StdioFile out("stdout", stdout);
    Pl_ASCII85Decoder decode("decode", &out);

    try {
        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}